

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * kj::_::operator*(String *__return_storage_ptr__,long param_2,undefined8 param_3,
                         undefined8 param_4,CappedArray<char,_14UL> *param_5)

{
  int *value;
  Array<char> local_40;
  CappedArray<char,_14UL> local_28;
  
  operator*<unsigned_char>(&local_40);
  toCharSequence<int&>(&local_28,(kj *)(param_2 + 4),value);
  concat<kj::String,kj::StringPtr&,kj::CappedArray<char,14ul>>
            (__return_storage_ptr__,(_ *)&local_40,(String *)(param_2 + 8),(StringPtr *)&local_28,
             param_5);
  Array<char>::~Array(&local_40);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}